

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.cpp
# Opt level: O0

void __thiscall CParticles::CParticles(CParticles *this)

{
  CGameClient *in_RDI;
  CParticle *in_stack_ffffffffffffffb0;
  CRenderGroup<0> *this_00;
  CComponent *local_20;
  
  CComponent::CComponent((CComponent *)in_RDI);
  *(undefined ***)&in_RDI->super_IGameClient = &PTR__CParticles_00299298;
  local_20 = (CComponent *)&in_RDI->m_All;
  do {
    CParticle::CParticle(in_stack_ffffffffffffffb0);
    local_20 = local_20 + 5;
  } while (local_20 != (CComponent *)(in_RDI[5].m_aClients[0x38].m_aaSkinPartNames[0] + 0x48));
  this_00 = (CRenderGroup<0> *)(in_RDI[5].m_aClients[0x38].m_aaSkinPartNames[0] + 0x58);
  CRenderGroup<0>::CRenderGroup(this_00);
  CRenderGroup<1>::CRenderGroup((CRenderGroup<1> *)this_00);
  CRenderGroup<2>::CRenderGroup((CRenderGroup<2> *)this_00);
  (*(*(_func_int ***)&in_RDI->super_IGameClient)[7])();
  ((CComponent *)(in_RDI[5].m_aClients[0x38].m_aaSkinPartNames[1] + 7))->_vptr_CComponent =
       (_func_int **)in_RDI;
  ((CComponent *)(in_RDI[5].m_aClients[0x38].m_aaSkinPartNames[1] + 0x17))->m_pClient = in_RDI;
  *(CGameClient **)(in_RDI[5].m_aClients[0x38].m_aaSkinPartNames[1] + 0x37) = in_RDI;
  return;
}

Assistant:

CParticles::CParticles()
{
	OnReset();
	m_RenderTrail.m_pParts = this;
	m_RenderExplosions.m_pParts = this;
	m_RenderGeneral.m_pParts = this;
}